

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtest.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  ushort uVar1;
  int iVar2;
  MeshType mt;
  DataType DVar3;
  uint uVar4;
  int iVar5;
  PtexCache *pPVar6;
  undefined4 extraout_var;
  char *pcVar8;
  size_t sVar9;
  long *plVar10;
  PtexMetaData *meta;
  ushort *puVar11;
  ostream *poVar12;
  void *data;
  byte bVar13;
  uint uVar14;
  int iVar15;
  float pixel [3];
  String error;
  float local_b0 [4];
  void *local_a0;
  int local_98;
  uint local_94;
  char *local_90;
  undefined8 local_88;
  char local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  long *plVar7;
  
  local_90 = &local_80;
  local_88 = 0;
  local_80 = '\0';
  pPVar6 = Ptex::v2_2::PtexCache::create(0,0,false,(PtexInputHandler *)0x0,(PtexErrorHandler *)0x0);
  (*pPVar6->_vptr_PtexCache[3])(pPVar6,"foo/bar:.");
  iVar2 = (*pPVar6->_vptr_PtexCache[5])(pPVar6,"test.ptx",&local_90);
  pcVar8 = local_90;
  plVar7 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar7 == (long *)0x0) {
    if (local_90 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x161280);
    }
    else {
      sVar9 = strlen(local_90);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    iVar2 = 1;
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"meshType: ",10);
    mt = (**(code **)(*plVar7 + 0x28))(plVar7);
    pcVar8 = Ptex::v2_2::MeshTypeName(mt);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1611a0);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dataType: ",10);
    DVar3 = (**(code **)(*plVar7 + 0x30))(plVar7);
    pcVar8 = Ptex::v2_2::DataTypeName(DVar3);
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1611a0);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"numChannels: ",0xd);
    iVar2 = (**(code **)(*plVar7 + 0x58))(plVar7);
    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"alphaChannel: ",0xe);
    iVar2 = (**(code **)(*plVar7 + 0x50))(plVar7);
    if (iVar2 == -1) {
      plVar10 = &std::cout;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(none)",6);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    }
    else {
      iVar2 = (**(code **)(*plVar7 + 0x50))(plVar7);
      plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    }
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"numFaces: ",10);
    iVar2 = (**(code **)(*plVar7 + 0x60))(plVar7);
    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    meta = (PtexMetaData *)(**(code **)(*plVar7 + 0x78))(plVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"numMetaKeys: ",0xd);
    iVar2 = (*meta->_vptr_PtexMetaData[3])(meta);
    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    iVar2 = (*meta->_vptr_PtexMetaData[3])(meta);
    if (iVar2 != 0) {
      DumpMetaData(meta);
    }
    (*meta->_vptr_PtexMetaData[2])(meta);
    iVar2 = (**(code **)(*plVar7 + 0x60))(plVar7);
    if (0 < iVar2) {
      iVar15 = 0;
      local_98 = iVar2;
      do {
        puVar11 = (ushort *)(**(code **)(*plVar7 + 0x80))(plVar7,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"face ",5);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,":\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  res: ",7);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)(char)*puVar11);
        local_b0[0]._0_1_ = 0x20;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_b0,1);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)*(char *)((long)puVar11 + 1));
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  adjface: ",0xb);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,*(int *)(puVar11 + 2));
        local_b0[0]._0_1_ = 0x20;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_b0,1);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,*(int *)(puVar11 + 4));
        local_b0[0]._0_1_ = 0x20;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_b0,1);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,*(int *)(puVar11 + 6));
        local_b0[0]._0_1_ = 0x20;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_b0,1);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,*(int *)(puVar11 + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  adjedge: ",0xb);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,(byte)puVar11[1] & 3);
        local_b0[0]._0_1_ = 0x20;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_b0,1);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,(byte)((byte)puVar11[1] >> 2) & 3);
        local_b0[0]._0_1_ = 0x20;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_b0,1);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,(byte)((byte)puVar11[1] >> 4) & 3);
        local_b0[0]._0_1_ = 0x20;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_b0,1);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,(uint)(byte)((byte)puVar11[1] >> 6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"  flags: ",9);
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,(uint)*(byte *)((long)puVar11 + 3));
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        uVar1 = *puVar11;
        uVar14 = (uint)uVar1;
        uVar4 = (**(code **)(*plVar7 + 0x30))(plVar7);
        iVar2 = *(int *)(Ptex::v2_2::DataSize(Ptex::v2_2::DataType)::sizes + (ulong)uVar4 * 4);
        iVar5 = (**(code **)(*plVar7 + 0x58))(plVar7);
        uVar4 = (uint)(uVar1 >> 8);
        bVar13 = (byte)(uVar1 >> 8);
        data = malloc((long)(iVar2 * iVar5 * ((1 << ((byte)uVar1 & 0x1f)) << (bVar13 & 0x1f))));
        if (bVar13 != 0 && -1 < (short)uVar1 || '\0' < (char)(byte)uVar1) {
          do {
            local_a0 = (void *)CONCAT44(local_a0._4_4_,uVar14);
            uVar14 = uVar14 & 0xff | uVar4 << 8;
            local_94 = uVar4;
            (**(code **)(*plVar7 + 0x90))(plVar7,iVar15,data,0,uVar14);
            DVar3 = (**(code **)(*plVar7 + 0x30))(plVar7);
            iVar2 = (**(code **)(*plVar7 + 0x58))(plVar7);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"  ","");
            DumpData(SUB42(uVar14,0),DVar3,iVar2,data,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            uVar14 = (uint)(byte)((char)local_a0 - 1);
            if ((char)local_a0 == '\0') {
              uVar14 = 0;
            }
            uVar4 = (uint)(byte)((char)local_94 - 1);
            if ((char)local_94 == '\0') {
              uVar4 = 0;
            }
          } while (('\0' < (char)uVar14) || ('\0' < (char)uVar4));
        }
        local_a0 = data;
        (**(code **)(*plVar7 + 0x90))(plVar7,iVar15,data,0,0);
        DVar3 = (**(code **)(*plVar7 + 0x30))(plVar7);
        iVar2 = (**(code **)(*plVar7 + 0x58))(plVar7);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"  ","");
        DumpData((Res)((ushort)uVar14 & 0xff | (ushort)(uVar4 << 8)),DVar3,iVar2,local_a0,&local_70)
        ;
        iVar2 = local_98;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        free(local_a0);
        local_b0[0] = -1.0;
        local_b0[1] = -1.0;
        local_b0[2] = -1.0;
        (**(code **)(*plVar7 + 0xa8))(plVar7,iVar15,1,1,local_b0,3,3);
        if ((((local_b0[0] != 0.0) || (NAN(local_b0[0]))) || (local_b0[1] != 0.0)) ||
           (NAN(local_b0[1]))) {
LAB_0010d58e:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"pixel should be zero",0x14);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
          iVar2 = 1;
          goto LAB_0010d5d9;
        }
        if ((local_b0[2] != 0.0) || (NAN(local_b0[2]))) goto LAB_0010d58e;
        iVar15 = iVar15 + 1;
      } while (iVar15 != iVar2);
    }
    iVar2 = 0;
LAB_0010d5d9:
    (**(code **)(*plVar7 + 0x10))(plVar7);
  }
  (*pPVar6->_vptr_PtexCache[2])(pPVar6);
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return iVar2;
}

Assistant:

int main(int /*argc*/, char** /*argv*/)
{
    Ptex::String error;
    PtexPtr<PtexCache> c(PtexCache::create(0,0));
    c->setSearchPath("foo/bar:.");
    PtexPtr<PtexTexture> r(c->get("test.ptx", error));

    if (!r) {
        std::cerr << error.c_str() << std::endl;
        return 1;
    }
    std::cout << "meshType: " << Ptex::MeshTypeName(r->meshType()) << std::endl;
    std::cout << "dataType: " << Ptex::DataTypeName(r->dataType()) << std::endl;
    std::cout << "numChannels: " << r->numChannels() << std::endl;
    std::cout << "alphaChannel: ";
    if (r->alphaChannel() == -1) std::cout << "(none)" << std::endl;
    else std::cout << r->alphaChannel() << std::endl;
    std::cout << "numFaces: " << r->numFaces() << std::endl;

    PtexMetaData* meta = r->getMetaData();
    std::cout << "numMetaKeys: " << meta->numKeys() << std::endl;
    if (meta->numKeys()) DumpMetaData(meta);
    meta->release();

    int nfaces = r->numFaces();
    for (int i = 0; i < nfaces; i++) {
        const Ptex::FaceInfo& f = r->getFaceInfo(i);
        std::cout << "face " << i << ":\n"
                  << "  res: " << int(f.res.ulog2) << ' ' << int(f.res.vlog2) << "\n"
                  << "  adjface: " 
                  << f.adjfaces[0] << ' '
                  << f.adjfaces[1] << ' '
                  << f.adjfaces[2] << ' '
                  << f.adjfaces[3] << "\n"
                  << "  adjedge: " 
                  << f.adjedge(0) << ' '
                  << f.adjedge(1) << ' '
                  << f.adjedge(2) << ' '
                  << f.adjedge(3) << "\n"
                  << "  flags: " << int(f.flags) << "\n";

        Ptex::Res res = f.res;
        void* data = malloc(Ptex::DataSize(r->dataType()) * r->numChannels() * res.size());
        while (res.ulog2 > 0 || res.vlog2 > 0) {
            r->getData(i, data, 0, res);
            DumpData(res, r->dataType(), r->numChannels(), data, "  ");
            if (res.ulog2) res.ulog2--;
            if (res.vlog2) res.vlog2--;
        }
        r->getData(i, data, 0, Ptex::Res(0,0));
        DumpData(res, r->dataType(), r->numChannels(), data, "  ");
        free(data);

        // Read more channels than are available.
        // This should wipe pixel with zeroes and nothing more.
        float pixel[] = {-1.0f, -1.0f, -1.0f};
        r->getPixel(i, 1, 1, pixel, 3, 3);
        if (pixel[0] != 0.0f || pixel[1] != 0.0f || pixel[2] != 0.0f) {
                std::cerr << "pixel should be zero" << std::endl;
                return 1;
        }
    }

    return 0;
}